

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.h
# Opt level: O0

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  AsyncInputStream local_30;
  undefined8 local_28;
  AsyncInputStream *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  this_local = (AsyncInputStream *)__buf;
  buffer_local.ptr = (uchar *)__nbytes;
  buffer_local.size_ = (size_t)this;
  ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  read(&local_30,__fd,__buf,__nbytes);
  Promise<unsigned_long>::ignoreResult((Promise<unsigned_long> *)this);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_30);
  return (ssize_t)this;
}

Assistant:

Promise<void> read(ArrayPtr<byte> buffer) {
    return read(buffer, buffer.size()).ignoreResult();
  }